

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

void srunner_run_tagged(SRunner *sr,char *sname,char *tcname,char *include_tags,char *exclude_tags,
                       print_output print_mode)

{
  char *pcStack_30;
  print_output print_mode_local;
  char *exclude_tags_local;
  char *include_tags_local;
  char *tcname_local;
  char *sname_local;
  SRunner *sr_local;
  
  include_tags_local = tcname;
  if (tcname == (char *)0x0) {
    include_tags_local = getenv("CK_RUN_CASE");
  }
  tcname_local = sname;
  if (sname == (char *)0x0) {
    tcname_local = getenv("CK_RUN_SUITE");
  }
  exclude_tags_local = include_tags;
  if (include_tags == (char *)0x0) {
    exclude_tags_local = getenv("CK_INCLUDE_TAGS");
  }
  pcStack_30 = exclude_tags;
  if (exclude_tags == (char *)0x0) {
    pcStack_30 = getenv("CK_EXCLUDE_TAGS");
  }
  if (sr != (SRunner *)0x0) {
    if (CK_ENV < print_mode) {
      eprintf("Bad print_mode argument to srunner_run_all: %d",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
              ,0x31e,(ulong)print_mode);
    }
    memset(&srunner_run_tagged::sigalarm_new_action,0,0x98);
    srunner_run_tagged::sigalarm_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(0xe,(sigaction *)&srunner_run_tagged::sigalarm_new_action,
              (sigaction *)&srunner_run_tagged::sigalarm_old_action);
    memset(&srunner_run_tagged::sigint_new_action,0,0x98);
    srunner_run_tagged::sigint_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(2,(sigaction *)&srunner_run_tagged::sigint_new_action,(sigaction *)&sigint_old_action)
    ;
    memset(&srunner_run_tagged::sigterm_new_action,0,0x98);
    srunner_run_tagged::sigterm_new_action.__sigaction_handler.sa_handler = sig_handler;
    sigaction(0xf,(sigaction *)&srunner_run_tagged::sigterm_new_action,
              (sigaction *)&sigterm_old_action);
    srunner_run_init(sr,print_mode);
    srunner_iterate_suites
              (sr,tcname_local,include_tags_local,exclude_tags_local,pcStack_30,print_mode);
    srunner_run_end(sr,print_mode);
    sigaction(0xe,(sigaction *)&srunner_run_tagged::sigalarm_old_action,(sigaction *)0x0);
    sigaction(2,(sigaction *)&sigint_old_action,(sigaction *)0x0);
    sigaction(0xf,(sigaction *)&sigterm_old_action,(sigaction *)0x0);
  }
  return;
}

Assistant:

void srunner_run_tagged(SRunner * sr, const char *sname, const char *tcname,
                        const char *include_tags, const char *exclude_tags,
                        enum print_output print_mode)
{
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    static struct sigaction sigalarm_old_action;
    static struct sigaction sigalarm_new_action;
    static struct sigaction sigint_new_action;
    static struct sigaction sigterm_new_action;
#endif /* HAVE_SIGACTION && HAVE_FORK */

    /*  Get the selected test suite and test case from the
       environment.  */
    if(!tcname)
        tcname = getenv("CK_RUN_CASE");
    if(!sname)
        sname = getenv("CK_RUN_SUITE");
    if(!include_tags)
        include_tags = getenv("CK_INCLUDE_TAGS");
    if(!exclude_tags)
        exclude_tags = getenv("CK_EXCLUDE_TAGS");

    if(sr == NULL)
        return;
    if(print_mode >= CK_LAST)
    {
        eprintf("Bad print_mode argument to srunner_run_all: %d",
                __FILE__, __LINE__, print_mode);
    }
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    memset(&sigalarm_new_action, 0, sizeof(sigalarm_new_action));
    sigalarm_new_action.sa_handler = sig_handler;
    sigaction(SIGALRM, &sigalarm_new_action, &sigalarm_old_action);

    memset(&sigint_new_action, 0, sizeof(sigint_new_action));
    sigint_new_action.sa_handler = sig_handler;
    sigaction(SIGINT, &sigint_new_action, &sigint_old_action);

    memset(&sigterm_new_action, 0, sizeof(sigterm_new_action));
    sigterm_new_action.sa_handler = sig_handler;
    sigaction(SIGTERM, &sigterm_new_action, &sigterm_old_action);
#endif /* HAVE_SIGACTION && HAVE_FORK */
    srunner_run_init(sr, print_mode);
    srunner_iterate_suites(sr, sname, tcname, include_tags, exclude_tags,
                           print_mode);
    srunner_run_end(sr, print_mode);
#if defined(HAVE_SIGACTION) && defined(HAVE_FORK)
    sigaction(SIGALRM, &sigalarm_old_action, NULL);
    sigaction(SIGINT, &sigint_old_action, NULL);
    sigaction(SIGTERM, &sigterm_old_action, NULL);
#endif /* HAVE_SIGACTION && HAVE_FORK */
}